

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O0

from_chars_result_t<char>
fast_float::from_chars_advanced<double,char>
          (char *first,char *last,double *value,parse_options_t<char> options)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  char cVar22;
  undefined1 auVar23 [8];
  int64_t iVar24;
  undefined8 uVar25;
  size_t sVar26;
  long *plVar27;
  undefined1 auVar28 [8];
  bool bVar29;
  bool bVar30;
  int iVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  difference_type dVar35;
  long *plVar36;
  size_t sVar37;
  uint64_t uVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  byte bVar42;
  undefined4 uVar43;
  double dVar44;
  double dVar45;
  undefined1 auVar46 [16];
  from_chars_result_t<char> fVar48;
  adjusted_mantissa aVar49;
  double local_5d8;
  adjusted_mantissa local_508;
  ulong local_4f8;
  uint local_4f0;
  undefined1 auStack_4e8 [8];
  adjusted_mantissa am;
  undefined1 local_4d0 [8];
  parsed_number_string_t<char> pns;
  from_chars_result_t<char> answer;
  double *value_local;
  char *last_local;
  char *first_local;
  parse_options_t<char> options_local;
  errc local_458;
  char *frac_end;
  uint64_t minimal_nineteen_digit_integer;
  char *int_end;
  char *start;
  uint8_t digit_1;
  bool neg_exp;
  char *location_of_e;
  int64_t exp_number;
  char *local_410;
  byte local_401;
  long *plStack_400;
  uint8_t digit;
  char *before;
  int64_t exponent;
  char *local_3e8;
  size_t local_3e0;
  int64_t digit_count;
  char *end_of_integer_part;
  uint64_t i;
  char *start_digits;
  char decimal_point;
  long *plStack_3b8;
  chars_format fmt;
  long *local_3b0;
  parse_options_t<char> local_3a8;
  float local_3a0;
  int local_39c;
  float fmini;
  int upperbit_1;
  value128 product_1;
  int lz_1;
  undefined1 local_370 [8];
  adjusted_mantissa answer_5;
  int upperbit;
  value128 product;
  int lz;
  undefined1 local_330 [8];
  adjusted_mantissa answer_2;
  value128 product_2;
  int lz_2;
  fastfloat_uint word;
  uint64_t val;
  uint64_t val_1;
  uint64_t mul2;
  uint64_t mul1;
  uint64_t mask;
  value128 secondproduct_2;
  uint64_t precision_mask_2;
  int index_2;
  int local_208;
  value128 firstproduct_2;
  value128 secondproduct;
  uint64_t precision_mask;
  int index;
  int local_1c8;
  ulong local_1c0;
  value128 firstproduct;
  value128 secondproduct_1;
  uint64_t precision_mask_1;
  int index_1;
  int local_188;
  ulong local_180;
  value128 firstproduct_1;
  __uint128_t r_3;
  undefined1 local_148 [8];
  value128 answer_7;
  __uint128_t r_2;
  undefined1 local_118 [8];
  value128 answer_6;
  __uint128_t r_1;
  undefined1 local_e8 [8];
  value128 answer_4;
  __uint128_t r;
  undefined1 local_b8 [8];
  value128 answer_3;
  __uint128_t r_5;
  undefined1 local_88 [8];
  value128 answer_9;
  __uint128_t r_4;
  undefined1 local_50 [8];
  value128 answer_8;
  sbyte local_38;
  int bias;
  int hilz;
  undefined1 local_20 [8];
  adjusted_mantissa answer_10;
  undefined1 auVar47 [16];
  
  if (first == last) {
    local_458 = invalid_argument;
    options_local = (parse_options_t<char>)first;
    goto LAB_00557882;
  }
  local_3a8.format = options.format;
  start_digits._4_4_ = local_3a8.format;
  local_3a8.decimal_point = options.decimal_point;
  start_digits._3_1_ = local_3a8.decimal_point;
  am._8_8_ = options;
  plStack_3b8 = (long *)last;
  local_3b0 = (long *)first;
  local_3a8 = options;
  parsed_number_string_t<char>::parsed_number_string_t((parsed_number_string_t<char> *)local_4d0);
  pns.lastmatch._1_1_ = 0;
  pns.lastmatch._2_1_ = 0;
  pns.lastmatch._0_1_ = (char)*local_3b0 == '-';
  if (((char)*local_3b0 != '-') ||
     ((local_3b0 = (long *)((long)local_3b0 + 1), plVar36 = local_3b0, local_3b0 != plStack_3b8 &&
      ((*(char *)local_3b0 < ':' && '/' < *(char *)local_3b0 ||
       (*(char *)local_3b0 == start_digits._3_1_)))))) {
    plVar36 = local_3b0;
    i = (uint64_t)local_3b0;
    end_of_integer_part = (char *)0x0;
    while( true ) {
      bVar30 = false;
      if (local_3b0 != plStack_3b8) {
        bVar30 = (char)*local_3b0 < ':' && '/' < (char)*local_3b0;
      }
      if (!bVar30) break;
      end_of_integer_part =
           (char *)((long)end_of_integer_part * 10 + (long)((char)*local_3b0 + -0x30));
      local_3b0 = (long *)((long)local_3b0 + 1);
    }
    digit_count = (int64_t)local_3b0;
    local_3e0 = (long)local_3b0 - (long)plVar36;
    span<const_char>::span((span<const_char> *)&exponent,(char *)plVar36,local_3e0);
    plVar36 = plStack_3b8;
    pns.negative = (bool)(undefined1)exponent;
    pns.valid = (bool)exponent._1_1_;
    pns.too_many_digits = (bool)exponent._2_1_;
    pns._27_5_ = exponent._3_5_;
    pns.integer.ptr = local_3e8;
    before = (char *)0x0;
    if ((local_3b0 != plStack_3b8) && ((char)*local_3b0 == start_digits._3_1_)) {
      plStack_400 = (long *)((long)local_3b0 + 1);
      local_3b0 = plStack_400;
      while( true ) {
        dVar35 = std::distance<char_const*>((char *)local_3b0,(char *)plVar36);
        bVar30 = false;
        if (7 < dVar35) {
          bVar30 = ((*local_3b0 + 0x4646464646464646U | *local_3b0 + 0xcfcfcfcfcfcfcfd0U) &
                   0x8080808080808080) == 0;
        }
        if (!bVar30) break;
        uVar39 = (*local_3b0 + 0xcfcfcfcfcfcfcfd0U) * 10 + (*local_3b0 + 0xcfcfcfcfcfcfcfd0U >> 8);
        end_of_integer_part =
             (char *)((long)end_of_integer_part * 100000000 +
                     ((uVar39 & 0xff000000ff) * 0xf424000000064 +
                      (uVar39 >> 0x10 & 0xff000000ff) * 0x271000000001 >> 0x20));
        local_3b0 = local_3b0 + 1;
      }
      while( true ) {
        bVar30 = false;
        if (local_3b0 != plStack_3b8) {
          bVar30 = (char)*local_3b0 < ':' && '/' < (char)*local_3b0;
        }
        if (!bVar30) break;
        local_401 = (char)*local_3b0 - 0x30;
        local_3b0 = (long *)((long)local_3b0 + 1);
        end_of_integer_part = (char *)((long)end_of_integer_part * 10 + (ulong)local_401);
      }
      before = (char *)((long)plStack_400 - (long)local_3b0);
      span<const_char>::span
                ((span<const_char> *)&exp_number,(char *)plStack_400,
                 (long)local_3b0 - (long)plStack_400);
      pns.integer.length = exp_number;
      pns.fraction.ptr = local_410;
      local_3e0 = local_3e0 - (long)before;
    }
    plVar27 = local_3b0;
    uVar25 = pns._24_8_;
    plVar36 = local_3b0;
    if (local_3e0 != 0) {
      location_of_e = (char *)0x0;
      if ((((start_digits._4_4_ & scientific) == 0) || (local_3b0 == plStack_3b8)) ||
         (((char)*local_3b0 != 'e' && ((char)*local_3b0 != 'E')))) {
        local_3b0 = plVar27;
        if ((start_digits._4_4_ & scientific) != 0) goto joined_r0x00556163;
      }
      else {
        plVar36 = (long *)((long)local_3b0 + 1);
        bVar30 = false;
        if ((plVar36 == plStack_3b8) || (*(char *)plVar36 != '-')) {
          if ((plVar36 != plStack_3b8) && (*(char *)plVar36 == '+')) {
            plVar36 = (long *)((long)local_3b0 + 2);
          }
        }
        else {
          bVar30 = true;
          plVar36 = (long *)((long)local_3b0 + 2);
        }
        local_3b0 = plVar36;
        plVar36 = local_3b0;
        if ((local_3b0 == plStack_3b8) || ('9' < (char)*local_3b0 || (char)*local_3b0 < '0')) {
joined_r0x00556163:
          local_3b0 = plVar27;
          if ((start_digits._4_4_ & fixed) == 0) goto LAB_00556447;
        }
        else {
          while( true ) {
            bVar29 = false;
            if (local_3b0 != plStack_3b8) {
              bVar29 = (char)*local_3b0 < ':' && '/' < (char)*local_3b0;
            }
            if (!bVar29) break;
            if ((long)location_of_e < 0x10000000) {
              location_of_e =
                   (char *)((long)location_of_e * 10 + (ulong)(byte)((char)*local_3b0 - 0x30));
            }
            local_3b0 = (long *)((long)local_3b0 + 1);
          }
          if (bVar30) {
            location_of_e = (char *)-(long)location_of_e;
          }
          before = location_of_e + (long)before;
        }
      }
      pns.mantissa = (uint64_t)local_3b0;
      pns.lastmatch._1_1_ = 1;
      if (0x13 < (long)local_3e0) {
        int_end = (char *)i;
        while( true ) {
          bVar30 = false;
          if (((long *)int_end != plStack_3b8) && (bVar30 = true, *int_end != '0')) {
            bVar30 = *int_end == start_digits._3_1_;
          }
          if (!bVar30) break;
          if (*int_end == '0') {
            local_3e0 = local_3e0 - 1;
          }
          int_end = int_end + 1;
        }
        if (0x13 < (long)local_3e0) {
          pns.lastmatch._2_1_ = 1;
          end_of_integer_part = (char *)0x0;
          local_3b0 = (long *)pns._24_8_;
          sVar37 = span<const_char>::len((span<const_char> *)&pns.negative);
          sVar26 = pns.integer.length;
          for (; end_of_integer_part < (char *)0xde0b6b3a7640000 &&
                 local_3b0 != (long *)(uVar25 + sVar37);
              end_of_integer_part =
                   (char *)((long)end_of_integer_part * 10 + (long)((char)lVar41 + -0x30))) {
            lVar41 = *local_3b0;
            local_3b0 = (long *)((long)local_3b0 + 1);
          }
          if (end_of_integer_part < (char *)0xde0b6b3a7640000) {
            local_3b0 = (long *)pns.integer.length;
            sVar37 = span<const_char>::len((span<const_char> *)&pns.integer.length);
            for (; end_of_integer_part < (char *)0xde0b6b3a7640000 &&
                   local_3b0 != (long *)(sVar26 + sVar37);
                end_of_integer_part =
                     (char *)((long)end_of_integer_part * 10 + (long)((char)lVar41 + -0x30))) {
              lVar41 = *local_3b0;
              local_3b0 = (long *)((long)local_3b0 + 1);
            }
            lVar41 = pns.integer.length - (long)local_3b0;
          }
          else {
            lVar41 = digit_count - (long)local_3b0;
          }
          before = location_of_e + lVar41;
        }
      }
      local_4d0 = (undefined1  [8])before;
      pns.exponent = (int64_t)end_of_integer_part;
      plVar36 = local_3b0;
    }
  }
LAB_00556447:
  local_3b0 = plVar36;
  if ((pns.lastmatch._1_1_ & 1) == 0) {
    fVar48 = detail::parse_infnan<double,char>(first,last,value);
    options_local = (parse_options_t<char>)fVar48.ptr;
    local_458 = fVar48.ec;
    goto LAB_00557882;
  }
  answer.ptr._0_4_ = 0;
  pns.fraction.length = pns.mantissa;
  iVar31 = binary_format<double>::min_exponent_fast_path();
  auVar23 = local_4d0;
  if ((((long)iVar31 <= (long)local_4d0) &&
      (iVar31 = binary_format<double>::max_exponent_fast_path(), iVar24 = pns.exponent,
      (long)auVar23 <= (long)iVar31)) && ((pns.lastmatch._2_1_ & 1) == 0)) {
    local_3a0 = detail::rounds_to_nearest()::fmin;
    if ((detail::rounds_to_nearest()::fmin + 1.0 != 1.0 - detail::rounds_to_nearest()::fmin) ||
       (NAN(detail::rounds_to_nearest()::fmin + 1.0) || NAN(1.0 - detail::rounds_to_nearest()::fmin)
       )) {
      if ((-1 < (long)local_4d0) &&
         (uVar38 = binary_format<double>::max_mantissa_fast_path((int64_t)local_4d0),
         (ulong)iVar24 <= uVar38)) {
        if (pns.exponent == 0) {
          local_5d8 = -0.0;
          if (((byte)pns.lastmatch & 1) == 0) {
            local_5d8 = 0.0;
          }
          *value = local_5d8;
          options_local.format = (undefined4)pns.fraction.length;
          options_local.decimal_point = pns.fraction.length._4_1_;
          options_local._5_3_ = pns.fraction.length._5_3_;
          local_458 = 0;
        }
        else {
          auVar47._8_4_ = (int)((ulong)pns.exponent >> 0x20);
          auVar47._0_8_ = pns.exponent;
          auVar47._12_4_ = 0x45300000;
          uVar43 = (undefined4)pns.exponent;
          dVar45 = binary_format<double>::exact_power_of_ten((int64_t)local_4d0);
          *value = ((auVar47._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar43) - 4503599627370496.0)) * dVar45;
          if (((byte)pns.lastmatch & 1) != 0) {
            *value = -*value;
          }
          options_local.format = (undefined4)pns.fraction.length;
          options_local.decimal_point = pns.fraction.length._4_1_;
          options_local._5_3_ = pns.fraction.length._5_3_;
          local_458 = 0;
        }
        goto LAB_00557882;
      }
    }
    else {
      uVar38 = binary_format<double>::max_mantissa_fast_path();
      if ((ulong)iVar24 <= uVar38) {
        auVar46._8_4_ = (int)((ulong)pns.exponent >> 0x20);
        auVar46._0_8_ = pns.exponent;
        auVar46._12_4_ = 0x45300000;
        *value = (auVar46._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)pns.exponent) - 4503599627370496.0);
        if ((long)local_4d0 < 0) {
          dVar45 = *value;
          dVar44 = binary_format<double>::exact_power_of_ten(-(long)local_4d0);
          *value = dVar45 / dVar44;
        }
        else {
          dVar45 = *value;
          dVar44 = binary_format<double>::exact_power_of_ten((int64_t)local_4d0);
          *value = dVar45 * dVar44;
        }
        if (((byte)pns.lastmatch & 1) != 0) {
          *value = -*value;
        }
        options_local.format = (undefined4)pns.fraction.length;
        options_local.decimal_point = pns.fraction.length._4_1_;
        options_local._5_3_ = pns.fraction.length._5_3_;
        local_458 = 0;
        goto LAB_00557882;
      }
    }
  }
  iVar24 = pns.exponent;
  auVar23 = local_4d0;
  adjusted_mantissa::adjusted_mantissa((adjusted_mantissa *)local_330);
  if ((iVar24 == 0) ||
     (iVar31 = binary_format<double>::smallest_power_of_ten(), (long)auVar23 < (long)iVar31)) {
    answer_2.mantissa._0_4_ = 0;
    local_330 = (undefined1  [8])0x0;
  }
  else {
    iVar31 = binary_format<double>::largest_power_of_ten();
    if ((long)iVar31 < (long)auVar23) {
      answer_2.mantissa._0_4_ = binary_format<double>::infinite_power();
      local_330 = (undefined1  [8])0x0;
    }
    else {
      if (iVar24 == 0) {
        __assert_fail("input_num > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                      ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
      }
      lVar41 = 0x3f;
      if (iVar24 != 0) {
        for (; (ulong)iVar24 >> lVar41 == 0; lVar41 = lVar41 + -1) {
        }
      }
      uVar32 = (uint)lVar41 ^ 0x3f;
      product.high._4_1_ = (byte)uVar32;
      uVar40 = iVar24 << (product.high._4_1_ & 0x3f);
      local_1c8 = auVar23._0_4_;
      iVar31 = local_1c8 * 2 + 0x2ac;
      uVar39 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)iVar31 * 8);
      value128::value128((value128 *)local_b8);
      auVar16._8_8_ = answer_4.low;
      auVar16._0_8_ = local_e8;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar40;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar39;
      unique0x00053e00 = auVar2 * auVar8;
      uVar38 = answer_4.high;
      local_b8 = (undefined1  [8])answer_4.high;
      uVar39 = (ulong)r;
      answer_3.low = (ulong)r;
      firstproduct.low = (ulong)r;
      auVar15 = unique0x00053e00;
      auVar20 = unique0x00053e00;
      if (((ulong)r & 0x1ff) == 0x1ff) {
        uVar1 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)iVar31 * 8 + 8);
        value128::value128((value128 *)local_e8);
        auVar15._8_8_ = answer_3.low;
        auVar15._0_8_ = local_b8;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar40;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar1;
        unique0x00053e00 = auVar3 * auVar9;
        if ((ulong)r_1 + uVar38 < (ulong)r_1) {
          firstproduct.low = uVar39 + 1;
        }
        auVar20._8_8_ = firstproduct.low;
        auVar20._0_8_ = (ulong)r_1 + uVar38;
        auVar16 = unique0x00053e00;
      }
      firstproduct.low = auVar20._8_8_;
      local_1c0 = auVar20._0_8_;
      answer_4.low = auVar16._8_8_;
      local_e8 = auVar16._0_8_;
      answer_3.low = auVar15._8_8_;
      local_b8 = auVar15._0_8_;
      answer_5._12_4_ = -(auVar20._12_4_ >> 0x1f);
      cVar22 = (char)answer_5._12_4_;
      iVar31 = binary_format<double>::mantissa_explicit_bits();
      local_330 = (undefined1  [8])(firstproduct.low >> ((cVar22 - (char)iVar31) + 0x3dU & 0x3f));
      iVar31 = (local_1c8 * 0x3526a >> 0x10) + 0x3f + answer_5._12_4_;
      iVar33 = binary_format<double>::minimum_exponent();
      answer_2.mantissa._0_4_ = (iVar31 - uVar32) - iVar33;
      if ((int)(uint)answer_2.mantissa < 1) {
        if ((int)(1 - (uint)answer_2.mantissa) < 0x40) {
          uVar39 = (ulong)local_330 >> (1U - (char)(uint)answer_2.mantissa & 0x3f);
          uVar39 = (uVar39 & 1) + uVar39 >> 1;
          local_330 = (undefined1  [8])uVar39;
          iVar31 = binary_format<double>::mantissa_explicit_bits();
          answer_2.mantissa._0_4_ = (uint)((ulong)(1L << ((byte)iVar31 & 0x3f)) <= uVar39);
        }
        else {
          answer_2.mantissa._0_4_ = 0;
          local_330 = (undefined1  [8])0x0;
        }
      }
      else {
        if ((((local_1c0 < 2) &&
             (iVar31 = binary_format<double>::min_exponent_round_to_even(),
             (long)iVar31 <= (long)auVar23)) &&
            (iVar31 = binary_format<double>::max_exponent_round_to_even(), auVar28 = local_330,
            (long)auVar23 <= (long)iVar31)) &&
           ((((ulong)local_330 & 3) == 1 &&
            (cVar22 = answer_5._12_1_, iVar31 = binary_format<double>::mantissa_explicit_bits(),
            (long)auVar28 << ((cVar22 - (char)iVar31) + 0x3dU & 0x3f) == firstproduct.low)))) {
          local_330 = (undefined1  [8])((ulong)local_330 & 0xfffffffffffffffe);
        }
        uVar39 = ((ulong)local_330 & 1) + (long)local_330 >> 1;
        local_330 = (undefined1  [8])uVar39;
        iVar31 = binary_format<double>::mantissa_explicit_bits();
        if ((ulong)(2L << ((byte)iVar31 & 0x3f)) <= uVar39) {
          iVar31 = binary_format<double>::mantissa_explicit_bits();
          local_330 = (undefined1  [8])(1L << ((byte)iVar31 & 0x3f));
          answer_2.mantissa._0_4_ = (uint)answer_2.mantissa + 1;
        }
        iVar31 = binary_format<double>::mantissa_explicit_bits();
        uVar32 = (uint)answer_2.mantissa;
        local_330 = (undefined1  [8])
                    ((1L << ((byte)iVar31 & 0x3f) ^ 0xffffffffffffffffU) & (ulong)local_330);
        iVar31 = binary_format<double>::infinite_power();
        if (iVar31 <= (int)uVar32) {
          answer_2.mantissa._0_4_ = binary_format<double>::infinite_power();
          local_330 = (undefined1  [8])0x0;
        }
      }
    }
  }
  auVar23 = local_4d0;
  local_4f0 = (uint)answer_2.mantissa;
  local_4f8 = (ulong)local_330;
  auStack_4e8 = local_330;
  am.mantissa._0_4_ = (uint)answer_2.mantissa;
  if (((pns.lastmatch._2_1_ & 1) != 0) && (-1 < (int)(uint)answer_2.mantissa)) {
    uVar39 = pns.exponent + 1;
    adjusted_mantissa::adjusted_mantissa((adjusted_mantissa *)local_370);
    if ((uVar39 == 0) ||
       (iVar31 = binary_format<double>::smallest_power_of_ten(), (long)auVar23 < (long)iVar31)) {
      answer_5.mantissa._0_4_ = 0;
      local_370 = (undefined1  [8])0x0;
    }
    else {
      iVar31 = binary_format<double>::largest_power_of_ten();
      if ((long)iVar31 < (long)auVar23) {
        answer_5.mantissa._0_4_ = binary_format<double>::infinite_power();
        local_370 = (undefined1  [8])0x0;
      }
      else {
        if (uVar39 == 0) {
          __assert_fail("input_num > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                        ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
        }
        lVar41 = 0x3f;
        if (uVar39 != 0) {
          for (; uVar39 >> lVar41 == 0; lVar41 = lVar41 + -1) {
          }
        }
        product_1.high._4_4_ = (uint)lVar41 ^ 0x3f;
        uVar39 = uVar39 << (product_1.high._4_1_ & 0x3f);
        local_188 = auVar23._0_4_;
        iVar31 = local_188 * 2 + 0x2ac;
        uVar40 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)iVar31 * 8);
        value128::value128((value128 *)local_118);
        auVar14._8_8_ = answer_7.low;
        auVar14._0_8_ = local_148;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar39;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar40;
        unique0x00053e00 = auVar4 * auVar10;
        uVar38 = answer_7.high;
        local_118 = (undefined1  [8])answer_7.high;
        uVar40 = (ulong)r_2;
        answer_6.low = (ulong)r_2;
        firstproduct_1.low = (ulong)r_2;
        auVar17 = unique0x00053e00;
        auVar21 = unique0x00053e00;
        if (((ulong)r_2 & 0x1ff) == 0x1ff) {
          uVar1 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)iVar31 * 8 + 8);
          value128::value128((value128 *)local_148);
          auVar17._8_8_ = answer_6.low;
          auVar17._0_8_ = local_118;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar39;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar1;
          auVar14 = auVar5 * auVar11;
          r_3._0_8_ = auVar14._8_8_;
          if ((ulong)r_3 + uVar38 < (ulong)r_3) {
            firstproduct_1.low = uVar40 + 1;
          }
          auVar21._8_8_ = firstproduct_1.low;
          auVar21._0_8_ = (ulong)r_3 + uVar38;
        }
        firstproduct_1.low = auVar21._8_8_;
        local_180 = auVar21._0_8_;
        answer_7.low = auVar14._8_8_;
        local_148 = auVar14._0_8_;
        answer_6.low = auVar17._8_8_;
        local_118 = auVar17._0_8_;
        _fmini = local_180;
        product_1.low = firstproduct_1.low;
        local_39c = -(auVar21._12_4_ >> 0x1f);
        cVar22 = (char)local_39c;
        iVar31 = binary_format<double>::mantissa_explicit_bits();
        local_370 = (undefined1  [8])
                    (firstproduct_1.low >> ((cVar22 - (char)iVar31) + 0x3dU & 0x3f));
        iVar31 = ((local_188 * 0x3526a >> 0x10) + 0x3f + local_39c) - product_1.high._4_4_;
        iVar33 = binary_format<double>::minimum_exponent();
        answer_5.mantissa._0_4_ = iVar31 - iVar33;
        if ((int)(uint)answer_5.mantissa < 1) {
          if ((int)(1 - (uint)answer_5.mantissa) < 0x40) {
            uVar39 = (ulong)local_370 >> (1U - (char)(uint)answer_5.mantissa & 0x3f);
            uVar39 = (uVar39 & 1) + uVar39 >> 1;
            local_370 = (undefined1  [8])uVar39;
            iVar31 = binary_format<double>::mantissa_explicit_bits();
            answer_5.mantissa._0_4_ = (uint)((ulong)(1L << ((byte)iVar31 & 0x3f)) <= uVar39);
          }
          else {
            answer_5.mantissa._0_4_ = 0;
            local_370 = (undefined1  [8])0x0;
          }
        }
        else {
          if ((((_fmini < 2) &&
               (iVar31 = binary_format<double>::min_exponent_round_to_even(),
               (long)iVar31 <= (long)auVar23)) &&
              (iVar31 = binary_format<double>::max_exponent_round_to_even(), auVar28 = local_370,
              (long)auVar23 <= (long)iVar31)) &&
             ((((ulong)local_370 & 3) == 1 &&
              (cVar22 = (char)local_39c, iVar31 = binary_format<double>::mantissa_explicit_bits(),
              (long)auVar28 << ((cVar22 - (char)iVar31) + 0x3dU & 0x3f) == product_1.low)))) {
            local_370 = (undefined1  [8])((ulong)local_370 & 0xfffffffffffffffe);
          }
          uVar39 = ((ulong)local_370 & 1) + (long)local_370 >> 1;
          local_370 = (undefined1  [8])uVar39;
          iVar31 = binary_format<double>::mantissa_explicit_bits();
          if ((ulong)(2L << ((byte)iVar31 & 0x3f)) <= uVar39) {
            iVar31 = binary_format<double>::mantissa_explicit_bits();
            local_370 = (undefined1  [8])(1L << ((byte)iVar31 & 0x3f));
            answer_5.mantissa._0_4_ = (uint)answer_5.mantissa + 1;
          }
          iVar31 = binary_format<double>::mantissa_explicit_bits();
          uVar32 = (uint)answer_5.mantissa;
          local_370 = (undefined1  [8])
                      ((1L << ((byte)iVar31 & 0x3f) ^ 0xffffffffffffffffU) & (ulong)local_370);
          iVar31 = binary_format<double>::infinite_power();
          if (iVar31 <= (int)uVar32) {
            answer_5.mantissa._0_4_ = binary_format<double>::infinite_power();
            local_370 = (undefined1  [8])0x0;
          }
        }
      }
    }
    local_508.mantissa = (uint64_t)local_370;
    local_508.power2 = (uint)answer_5.mantissa;
    bVar30 = adjusted_mantissa::operator!=((adjusted_mantissa *)auStack_4e8,&local_508);
    if (bVar30) {
      if (pns.exponent == 0) {
        __assert_fail("input_num > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                      ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
      }
      lVar41 = 0x3f;
      if (pns.exponent != 0) {
        for (; (ulong)pns.exponent >> lVar41 == 0; lVar41 = lVar41 + -1) {
        }
      }
      uVar32 = (uint)lVar41 ^ 0x3f;
      product_2.high._4_1_ = (byte)uVar32;
      uVar40 = pns.exponent << (product_2.high._4_1_ & 0x3f);
      local_208 = local_4d0._0_4_;
      iVar31 = local_208 * 2 + 0x2ac;
      uVar39 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)iVar31 * 8);
      value128::value128((value128 *)local_50);
      auVar19._8_8_ = answer_9.low;
      auVar19._0_8_ = local_88;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar40;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar39;
      unique0x00053e00 = auVar6 * auVar12;
      uVar38 = answer_9.high;
      local_50 = (undefined1  [8])answer_9.high;
      uVar39 = (ulong)r_4;
      answer_8.low = (ulong)r_4;
      auVar18 = unique0x00053e00;
      if (((ulong)r_4 & 0x1ff) == 0x1ff) {
        uVar1 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)iVar31 * 8 + 8);
        value128::value128((value128 *)local_88);
        auVar18._8_8_ = answer_8.low;
        auVar18._0_8_ = local_50;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar40;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar1;
        unique0x00053e00 = auVar7 * auVar13;
        auVar19 = unique0x00053e00;
        if ((ulong)r_5 + uVar38 < (ulong)r_5) {
          uVar39 = uVar39 + 1;
        }
      }
      answer_9.low = auVar19._8_8_;
      local_88 = auVar19._0_8_;
      answer_8.low = auVar18._8_8_;
      local_50 = auVar18._0_8_;
      uVar34 = (uint)(uVar39 >> 0x3f) ^ 1;
      adjusted_mantissa::adjusted_mantissa((adjusted_mantissa *)local_20);
      local_38 = (sbyte)uVar34;
      local_20 = (undefined1  [8])(uVar39 << local_38);
      iVar31 = binary_format<double>::mantissa_explicit_bits();
      iVar33 = binary_format<double>::minimum_exponent();
      answer_8.high._4_4_ = iVar31 - iVar33;
      answer_10._12_4_ = local_208;
      am.mantissa._0_4_ =
           ((((local_208 * 0x3526a >> 0x10) + answer_8.high._4_4_) - uVar34) - uVar32) - 0x7fff;
      answer_2._8_8_ = local_20;
      auStack_4e8 = local_20;
      answer_10.mantissa._0_4_ = (uint)am.mantissa;
    }
  }
  if ((int)(uint)am.mantissa < 0) {
    aVar49.power2 = (uint)am.mantissa;
    aVar49.mantissa = (uint64_t)auStack_4e8;
    aVar49._12_4_ = 0;
    aVar49 = digit_comp<double,char>((parsed_number_string_t<char> *)local_4d0,aVar49);
    auStack_4e8 = (undefined1  [8])aVar49.mantissa;
    am.mantissa._0_4_ = aVar49.power2;
  }
  auVar23 = auStack_4e8;
  bVar42 = (byte)pns.lastmatch & 1;
  lVar41 = (long)(int)(uint)am.mantissa;
  iVar31 = binary_format<double>::mantissa_explicit_bits();
  iVar33 = binary_format<double>::sign_index();
  uVar32 = (uint)am.mantissa;
  *value = (double)((ulong)bVar42 << ((byte)iVar33 & 0x3f) |
                   lVar41 << ((byte)iVar31 & 0x3f) | (ulong)auVar23);
  if ((((pns.exponent != 0) && (auStack_4e8 == (undefined1  [8])0x0)) && ((uint)am.mantissa == 0))
     || (uVar34 = binary_format<double>::infinite_power(), uVar32 == uVar34)) {
    answer.ptr._0_4_ = result_out_of_range;
  }
  options_local.format = (undefined4)pns.fraction.length;
  options_local.decimal_point = pns.fraction.length._4_1_;
  options_local._5_3_ = pns.fraction.length._5_3_;
  local_458 = (errc)answer.ptr;
LAB_00557882:
  fVar48.ec = local_458;
  fVar48.ptr = (char *)options_local;
  fVar48._12_4_ = 0;
  return fVar48;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars_advanced(UC const * first, UC const * last,
                                      T &value, parse_options_t<UC> options)  noexcept  {

  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");
  static_assert (std::is_same<UC, char>::value ||
                 std::is_same<UC, wchar_t>::value ||
                 std::is_same<UC, char16_t>::value ||
                 std::is_same<UC, char32_t>::value , "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string_t<UC> pns = parse_number_string<UC>(first, last, options);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }

  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // The implementation of the Clinger's fast path is convoluted because
  // we want round-to-nearest in all cases, irrespective of the rounding mode
  // selected on the thread.
  // We proceed optimistically, assuming that detail::rounds_to_nearest() returns
  // true.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && !pns.too_many_digits) {
    // Unfortunately, the conventional Clinger's fast path is only possible
    // when the system rounds to the nearest float.
    //
    // We expect the next branch to almost always be selected.
    // We could check it first (before the previous branch), but
    // there might be performance advantages at having the check
    // be last.
    if(!cpp20_and_in_constexpr() && detail::rounds_to_nearest())  {
      // We have that fegetround() == FE_TONEAREST.
      // Next is Clinger's fast path.
      if (pns.mantissa <=binary_format<T>::max_mantissa_fast_path()) {
        value = T(pns.mantissa);
        if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
        else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
        if (pns.negative) { value = -value; }
        return answer;
      }
    } else {
      // We do not have that fegetround() == FE_TONEAREST.
      // Next is a modified Clinger's fast path, inspired by Jakub Jelínek's proposal
      if (pns.exponent >= 0 && pns.mantissa <=binary_format<T>::max_mantissa_fast_path(pns.exponent)) {
#if defined(__clang__)
        // Clang may map 0 to -0.0 when fegetround() == FE_DOWNWARD
        if(pns.mantissa == 0) {
          value = pns.negative ? -0. : 0.;
          return answer;
        }
#endif
        value = T(pns.mantissa) * binary_format<T>::exact_power_of_ten(pns.exponent);
        if (pns.negative) { value = -value; }
        return answer;
      }
    }
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits && am.power2 >= 0) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am = compute_error<binary_format<T>>(pns.exponent, pns.mantissa);
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = digit_comp<T>(pns, am); }
  to_float(pns.negative, am, value);
  // Test for over/underflow.
  if ((pns.mantissa != 0 && am.mantissa == 0 && am.power2 == 0) || am.power2 == binary_format<T>::infinite_power()) {
    answer.ec = std::errc::result_out_of_range;
  }
  return answer;
}